

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Promise<void> __thiscall
kj::Promise<void>::attach<capnp::LocalClient::BlockingScope>
          (Promise<void> *this,BlockingScope *attachments)

{
  BlockedCall *this_00;
  BlockingScope BVar1;
  PromiseNode *pPVar2;
  long *in_RDX;
  LocalClient *c;
  BlockingScope local_30;
  PromiseNode *local_28;
  
  local_30.client.ptr = (Maybe<capnp::LocalClient_&>)*in_RDX;
  *in_RDX = 0;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<capnp::LocalClient::BlockingScope>,kj::_::PromiseDisposer,capnp::LocalClient::BlockingScope>
            ((PromiseDisposer *)&local_28,(OwnPromiseNode *)attachments,&local_30);
  pPVar2 = local_28;
  BVar1.client.ptr = local_30.client.ptr;
  local_28 = (PromiseNode *)0x0;
  (this->super_PromiseBase).node.ptr = pPVar2;
  if (local_30.client.ptr != (LocalClient *)0x0) {
    *(undefined1 *)((long)local_30.client.ptr + 0x78) = 0;
    do {
      this_00 = *(BlockedCall **)((long)BVar1.client.ptr + 0x218);
      if (this_00 == (BlockedCall *)0x0) {
        return (PromiseBase)(PromiseBase)this;
      }
      capnp::LocalClient::BlockedCall::unblock(this_00);
    } while (*(char *)((long)BVar1.client.ptr + 0x78) != '\x01');
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}